

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3cue-main.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  size_t sVar2;
  ulong time;
  adu_t *adu_00;
  mp3_frame_t *frame_00;
  uchar *local_6320;
  mp3_frame_t *frame_out;
  adu_t *adu;
  mp3_frame_t frame;
  char to_buf [256];
  char from_buf [256];
  unsigned_long end;
  file_t outfile;
  aq_t qout;
  char outfilename [193];
  uint local_14c;
  ulong uStack_148;
  uint i;
  unsigned_long current;
  aq_t qin;
  file_t mp3file;
  mp3cue_file_t cuefile;
  void *pvStack_40;
  int c;
  mp3cue_track_t *cuetracks;
  FILE *cuein;
  int retval;
  char *mp3filename;
  char *cuefilename;
  char **argv_local;
  int argc_local;
  
  mp3filename = (char *)0x0;
  cuein._4_4_ = 0;
  cuetracks = (mp3cue_track_t *)0x0;
  pvStack_40 = (void *)0x0;
  while (cuefile.tracks._4_4_ = getopt(argc,argv,"c:C:"), -1 < cuefile.tracks._4_4_) {
    if (cuefile.tracks._4_4_ != 0x43) {
      if (cuefile.tracks._4_4_ != 99) {
        usage();
        goto LAB_00106fcf;
      }
      if (mp3filename != (char *)0x0) {
        free(mp3filename);
      }
      mp3filename = strdup(_optarg);
    }
  }
  if (_optind == argc) {
    usage();
  }
  else {
    filename = argv[_optind];
    if ((mp3filename == (char *)0x0) || (filename == (char *)0x0)) {
      usage();
      cuein._4_4_ = 1;
    }
    else {
      pvStack_40 = malloc(0xbe0);
      if (pvStack_40 == (void *)0x0) {
        fprintf(_stderr,"Could not allocate memory for tracks\n");
        cuein._4_4_ = 1;
      }
      else {
        cuefile.title[0x3b] = '\0';
        cuefile.title[0x3c] = '\0';
        cuefile.title[0x3d] = '\0';
        cuefile.title[0x3e] = '\0';
        cuefile.title[0x3f] = '\x14';
        cuefile.title[0x40] = '\0';
        cuefile._130_2_ = 0;
        yymp3_cue_file = (mp3cue_file_t *)&mp3file.pos;
        cuefile._136_8_ = pvStack_40;
        strncpy(cuefile.performer + 0x39,mp3filename,0x40);
        cuetracks = (mp3cue_track_t *)fopen(mp3filename,"r");
        if ((FILE *)cuetracks == (FILE *)0x0) {
          fprintf(_stderr,"Could not open cuefile %s\n",mp3filename);
          cuein._4_4_ = 1;
        }
        else {
          yyin = (FILE *)cuetracks;
          iVar1 = yyparse();
          if (iVar1 == 0) {
            iVar1 = file_open_read((file_t *)&qin.size,filename);
            if (iVar1 == 0) {
              fprintf(_stderr,"Could not open mp3 file: %s\n",filename);
              return 0;
            }
            aq_init((aq_t *)&current);
            uStack_148 = 0;
            for (local_14c = 0; local_14c < (uint)cuefile.title._59_4_; local_14c = local_14c + 1) {
              sVar2 = strlen((char *)(cuefile._136_8_ + (ulong)local_14c * 0x98 + 0x49));
              if ((sVar2 == 0) ||
                 (sVar2 = strlen((char *)(cuefile._136_8_ + (ulong)local_14c * 0x98 + 8)),
                 sVar2 == 0)) {
                snprintf((char *)&qout.size,0xc0,"%02d. %s.mp3",
                         (ulong)*(uint *)(cuefile._136_8_ + (ulong)local_14c * 0x98 + 4),
                         cuefile.performer + 0x39);
              }
              else {
                snprintf((char *)&qout.size,0xc0,"%02d. %s - %s.mp3",
                         (ulong)*(uint *)(cuefile._136_8_ + (ulong)local_14c * 0x98 + 4),
                         cuefile._136_8_ + (ulong)local_14c * 0x98 + 0x49,
                         cuefile._136_8_ + (ulong)local_14c * 0x98 + 8);
              }
              aq_init((aq_t *)&outfile.pos);
              iVar1 = file_open_write((file_t *)&end,(char *)&qout.size);
              if (iVar1 == 0) {
                fprintf(_stderr,"Could not open mp3 file: %s\n",&qout.size);
                file_close((file_t *)&qin.size);
                cuein._4_4_ = 1;
                goto LAB_00106fcf;
              }
              time = (ulong)(uint)(((*(int *)(cuefile._136_8_ + (ulong)local_14c * 0x98 + 0x8c) *
                                     0x3c + *(int *)(cuefile._136_8_ + (ulong)local_14c * 0x98 +
                                                    0x90)) * 100 +
                                   *(int *)(cuefile._136_8_ + (ulong)local_14c * 0x98 + 0x94)) * 10)
              ;
              format_time(uStack_148,to_buf + 0xf8,0x100);
              format_time(time,(char *)(frame.raw + 0xf98),0x100);
              if (time == 0) {
                local_6320 = "end";
              }
              else {
                local_6320 = frame.raw + 0xf98;
              }
              printf("Extracting track %d (%s): %s - %s...\n",(ulong)local_14c,&qout.size,
                     to_buf + 0xf8,local_6320);
              iVar1 = mp3cue_write_id3((file_t *)&end,(mp3cue_file_t *)&mp3file.pos,
                                       (mp3cue_track_t *)(cuefile._136_8_ + (ulong)local_14c * 0x98)
                                      );
              if (iVar1 == 0) {
                fprintf(_stderr,"Could not write id3 tags to file: %s\n",&qout.size);
                file_close((file_t *)&end);
                file_close((file_t *)&qin.size);
                cuein._4_4_ = 1;
                goto LAB_00106fcf;
              }
              for (; uStack_148 < time || local_14c == cuefile.title._59_4_ - 1;
                  uStack_148 = frame.frame_data_size / 1000 + uStack_148) {
                iVar1 = mp3_next_frame((file_t *)&qin.size,(mp3_frame_t *)&adu);
                if (iVar1 < 1) {
                  if (local_14c != cuefile.title._59_4_ - 1) {
                    fprintf(_stderr,"Could not read the next frame from the mp3 file...\n");
                  }
                  break;
                }
                iVar1 = aq_add_frame((aq_t *)&current,(mp3_frame_t *)&adu);
                if (iVar1 != 0) {
                  adu_00 = aq_get_adu((aq_t *)&current);
                  if (adu_00 == (adu_t *)0x0) {
                    __assert_fail("adu != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3cue-main.c"
                                  ,0xc5,"int main(int, char **)");
                  }
                  iVar1 = aq_add_adu((aq_t *)&outfile.pos,adu_00);
                  if (iVar1 != 0) {
                    frame_00 = aq_get_frame((aq_t *)&outfile.pos);
                    if (frame_00 == (mp3_frame_t *)0x0) {
                      __assert_fail("frame_out != NULL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3cue-main.c"
                                    ,0xc9,"int main(int, char **)");
                    }
                    memset(frame_00->raw,0,frame_00->si_size + 4);
                    iVar1 = mp3_fill_hdr(frame_00);
                    if (((iVar1 == 0) || (iVar1 = mp3_fill_si(frame_00), iVar1 == 0)) ||
                       (iVar1 = mp3_write_frame((file_t *)&end,frame_00), iVar1 < 1)) {
                      fprintf(_stderr,"Could not write frame\n");
                      file_close((file_t *)&qin.size);
                      file_close((file_t *)&end);
                      cuein._4_4_ = 1;
                      goto LAB_00106fcf;
                    }
                    free(frame_00);
                  }
                  free(adu_00);
                }
              }
              file_close((file_t *)&end);
              aq_destroy((aq_t *)&outfile.pos);
              fprintf(_stderr,"%s written\n",&qout.size);
            }
            file_close((file_t *)&qin.size);
            aq_destroy((aq_t *)&current);
          }
          else {
            cuein._4_4_ = 1;
          }
        }
      }
    }
  }
LAB_00106fcf:
  if (cuetracks != (mp3cue_track_t *)0x0) {
    fclose((FILE *)cuetracks);
  }
  if (pvStack_40 != (void *)0x0) {
    free(pvStack_40);
  }
  if (mp3filename != (char *)0x0) {
    free(mp3filename);
  }
  return cuein._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    char *cuefilename = NULL,
        *mp3filename = NULL;
    int retval = EXIT_SUCCESS;
    FILE *cuein = NULL;
    mp3cue_track_t *cuetracks = NULL;

    int c;
    while ((c = getopt(argc, argv, "c:C:")) >= 0) {
        switch (c) {
        case 'c':
            if (cuefilename != NULL) {
                free(cuefilename);
            }
            cuefilename = strdup(optarg);
            break;

        case 'C':
            break;

        default:
            usage();
            goto exit;
        }
    }

    if (optind == argc) {
        usage();
        goto exit;
    }
    mp3filename = argv[optind];

    if ((cuefilename == NULL) || (mp3filename == NULL)) {
        usage();
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Initialize the mp3 cue structure.
    **/
    mp3cue_file_t cuefile;
    cuetracks = malloc(sizeof(mp3cue_track_t) * MP3CUE_DEFAULT_TRACK_NUMBER);
    if (cuetracks == NULL) {
        fprintf(stderr, "Could not allocate memory for tracks\n");
        retval = EXIT_FAILURE;
        goto exit;
    }
    cuefile.tracks = cuetracks;
    cuefile.track_number = 0;
    cuefile.max_track_number = MP3CUE_DEFAULT_TRACK_NUMBER;
    yymp3_cue_file = &cuefile;
    strncpy(cuefile.title, cuefilename, MP3CUE_MAX_STRING_LENGTH);

    /*M
      Open the input file.
    **/
    cuein = fopen(cuefilename, "r");
    if (cuein == NULL) {
        fprintf(stderr, "Could not open cuefile %s\n", cuefilename);
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Parse the input file.
    **/
    extern FILE *yyin;
    yyin = cuein;

    if (yyparse() != 0) {
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Open the MP3 file.
    **/
    file_t mp3file;
    if (!file_open_read(&mp3file, mp3filename)) {
        fprintf(stderr, "Could not open mp3 file: %s\n", mp3filename);
        retval = EXIT_FAILURE;
        return 0;
    }

    aq_t qin;
    aq_init(&qin);

    unsigned long current = 0;

    /*M
      For each track, cut out the relevant part and save it.
    **/
    unsigned int i;
    for (i = 0; i < cuefile.track_number; i++) {
        char outfilename[MP3CUE_MAX_STRING_LENGTH * 3 + 1];
        if (strlen(cuefile.tracks[i].performer) > 0 &&
            strlen(cuefile.tracks[i].title) > 0) {
            snprintf(outfilename, MP3CUE_MAX_STRING_LENGTH * 3,
                     "%02d. %s - %s.mp3", cuefile.tracks[i].number,
                     cuefile.tracks[i].performer, cuefile.tracks[i].title);
        } else {
            snprintf(outfilename, MP3CUE_MAX_STRING_LENGTH * 3,
                     "%02d. %s.mp3", cuefile.tracks[i].number,
                     cuefile.title);
        }

        aq_t qout;
        aq_init(&qout);

        /*M
          Open the output MP3 file.
        **/
        file_t outfile;
        if (!file_open_write(&outfile, outfilename)) {
            fprintf(stderr, "Could not open mp3 file: %s\n", outfilename);
            file_close(&mp3file);
            retval = EXIT_FAILURE;
            goto exit;
        }

        /* end time in msecs */
        unsigned long end = (((cuefile.tracks[i].index.minutes * 60) +
                              cuefile.tracks[i].index.seconds) * 100 +
                             cuefile.tracks[i].index.centiseconds) * 10;
        char from_buf[256], to_buf[256];
        format_time(current, from_buf, sizeof(from_buf));
        format_time(end, to_buf, sizeof(to_buf));
        printf("Extracting track %d (%s): %s - %s...\n", i, outfilename,
               from_buf, end ? to_buf : "end");

        /* write id3 tags */
        if (!mp3cue_write_id3(&outfile, &cuefile, &cuefile.tracks[i])) {
            fprintf(stderr, "Could not write id3 tags to file: %s\n", outfilename);
            file_close(&outfile);
            file_close(&mp3file);
            retval = EXIT_FAILURE;
            goto exit;
        }

        /*M
          Read in the input file

          Read while current < end or till the end of the file if it's the last track.
        **/
        while ((current < end) || (i == (cuefile.track_number - 1))) {
            mp3_frame_t frame;
            if (mp3_next_frame(&mp3file, &frame) > 0) {
                if (aq_add_frame(&qin, &frame)) {
                    adu_t *adu = aq_get_adu(&qin);
                    assert(adu != NULL);

                    if (aq_add_adu(&qout, adu)) {
                        mp3_frame_t *frame_out = aq_get_frame(&qout);
                        assert(frame_out != NULL);

                        memset(frame_out->raw, 0, 4 + frame_out->si_size);
                        if (!mp3_fill_hdr(frame_out) ||
                            !mp3_fill_si(frame_out) ||
                            (mp3_write_frame(&outfile, frame_out) <= 0)) {
                            fprintf(stderr, "Could not write frame\n");
                            file_close(&mp3file);
                            file_close(&outfile);
                            retval = 1;
                            goto exit;
                        }

                        free(frame_out);
                    }

                    free(adu);
                }

                current += frame.usec / 1000;
            } else {
                if (i != (cuefile.track_number - 1)) {
                    fprintf(stderr, "Could not read the next frame from the mp3 file...\n");
                }
                break;
            }
        }

        /*M
          Close the output file.
        **/
        file_close(&outfile);
        aq_destroy(&qout);

        fprintf(stderr, "%s written\n", outfilename);
    }

    /*M
      Close the input file.
    **/
    file_close(&mp3file);
    aq_destroy(&qin);


    /*M
      Cleanup the data structures.
    **/
    exit:
    if (cuein != NULL) {
        fclose(cuein);
    }
    if (cuetracks != NULL) {
        free(cuetracks);
    }

    if (cuefilename != NULL) {
        free(cuefilename);
    }

    return retval;
}